

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O3

void bsp_end(void)

{
  pointer ppVar1;
  Rdma *pRVar2;
  Bsmp *pBVar3;
  int iVar4;
  
  if (s_spmd == (Spmd *)0x0) {
    bsp_abort("bsp_end: called without calling bsp_begin() before\n");
  }
  if (s_spmd->m_closed == true) {
    bsp_abort("bsp_end: may not be called multiple times\n");
  }
  iVar4 = bsplib::Spmd::end_sync(s_spmd);
  if (iVar4 != 0) {
    bsp_abort(
             "bsp_sync/bsp_end: Some processes have called bsp_sync, while others have called bsp_end instead\n"
             );
  }
  pRVar2 = s_rdma;
  if (s_rdma != (Rdma *)0x0) {
    bsplib::Rdma::~Rdma(s_rdma);
  }
  operator_delete(pRVar2,0x500);
  pBVar3 = s_bsmp;
  s_rdma = (Rdma *)0x0;
  if (s_bsmp != (Bsmp *)0x0) {
    ppVar1 = (s_bsmp->m_payloads).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (ppVar1 != (pointer)0x0) {
      operator_delete(ppVar1,(long)(s_bsmp->m_payloads).
                                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar1
                     );
    }
    bsplib::A2A::~A2A(&pBVar3->m_a2a);
  }
  iVar4 = 0x218;
  operator_delete(pBVar3,0x218);
  s_bsmp = (Bsmp *)0x0;
  bsplib::Spmd::close(s_spmd,iVar4);
  if (s_spmd->m_closed != false) {
    return;
  }
  __assert_fail("s_spmd->closed()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsp.cc"
                ,0xff,"void bsp_end()");
}

Assistant:

void bsp_end() 
{
    if (!s_spmd)
        bsp_abort("bsp_end: called without calling bsp_begin() before\n");

    if (s_spmd->closed())
        bsp_abort("bsp_end: may not be called multiple times\n");

    if (s_spmd->end_sync())
        bsp_abort("bsp_sync/bsp_end: Some processes have called bsp_sync, "
               "while others have called bsp_end instead\n");

    
    delete s_rdma;
    s_rdma = NULL;
    delete s_bsmp;
    s_bsmp = NULL;

#ifdef PROFILE
    std::ostringstream out;
    bsplib::TicToc::print_stats( s_spmd->comm(), out );
    if ( s_spmd->pid() == 0 )
        printf("--- PROFILE between bsp_begin() - bsp_end() ---\n%s\n",
                out.str().c_str() );
#endif

    s_spmd->close();
    assert( s_spmd->closed() );
}